

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void cmExtraEclipseCDT4Generator::AddEnvVar(ostream *out,char *envVar,cmLocalGenerator *lg)

{
  bool bVar1;
  bool bVar2;
  cmState *this;
  cmake *pcVar3;
  string *psVar4;
  long lVar5;
  ulong uVar6;
  ostream *poVar7;
  undefined1 local_a8 [8];
  string valueToUse;
  cmValue cacheValue;
  string cacheEntryName;
  undefined1 local_48 [7];
  bool envVarSet;
  string envVarValue;
  cmMakefile *mf;
  cmLocalGenerator *lg_local;
  char *envVar_local;
  ostream *out_local;
  
  lg_local = (cmLocalGenerator *)envVar;
  envVar_local = (char *)out;
  envVarValue.field_2._8_8_ = cmLocalGenerator::GetMakefile(lg);
  std::__cxx11::string::string((string *)local_48);
  bVar1 = cmsys::SystemTools::GetEnv((char *)lg_local,(string *)local_48);
  cmStrCat<char_const(&)[22],char_const*&>
            ((string *)&cacheValue,(char (*) [22])"CMAKE_ECLIPSE_ENVVAR_",(char **)&lg_local);
  this = cmLocalGenerator::GetState(lg);
  valueToUse.field_2._8_8_ = cmState::GetInitializedCacheValue(this,(string *)&cacheValue);
  std::__cxx11::string::string((string *)local_a8);
  if ((bVar1) ||
     (bVar2 = cmValue::operator_cast_to_bool((cmValue *)((long)&valueToUse.field_2 + 8)), bVar2)) {
    if ((!bVar1) ||
       (bVar2 = cmValue::operator_cast_to_bool((cmValue *)((long)&valueToUse.field_2 + 8)), bVar2))
    {
      if ((bVar1) ||
         (bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&valueToUse.field_2 + 8)), !bVar1
         )) {
        psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&valueToUse.field_2 + 8));
        std::__cxx11::string::operator=((string *)local_a8,(string *)psVar4);
        lVar5 = std::__cxx11::string::find((string *)local_a8,(ulong)local_48);
        if (lVar5 == -1) {
          std::__cxx11::string::operator=((string *)local_a8,(string *)local_48);
          cmMakefile::AddCacheDefinition
                    ((cmMakefile *)envVarValue.field_2._8_8_,(string *)&cacheValue,
                     (string *)local_a8,(string *)&cacheValue,STRING,true);
          pcVar3 = cmMakefile::GetCMakeInstance((cmMakefile *)envVarValue.field_2._8_8_);
          psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
          cmake::SaveCache(pcVar3,psVar4);
        }
      }
      else {
        psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&valueToUse.field_2 + 8));
        std::__cxx11::string::operator=((string *)local_a8,(string *)psVar4);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)local_a8,(string *)local_48);
      cmMakefile::AddCacheDefinition
                ((cmMakefile *)envVarValue.field_2._8_8_,(string *)&cacheValue,(string *)local_a8,
                 (string *)&cacheValue,STRING,true);
      pcVar3 = cmMakefile::GetCMakeInstance((cmMakefile *)envVarValue.field_2._8_8_);
      psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
      cmake::SaveCache(pcVar3,psVar4);
    }
  }
  else {
    std::__cxx11::string::clear();
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    poVar7 = std::operator<<((ostream *)envVar_local,(char *)lg_local);
    poVar7 = std::operator<<(poVar7,"=");
    poVar7 = std::operator<<(poVar7,(string *)local_a8);
    std::operator<<(poVar7,"|");
  }
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&cacheValue);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AddEnvVar(std::ostream& out,
                                            const char* envVar,
                                            cmLocalGenerator& lg)
{
  cmMakefile* mf = lg.GetMakefile();

  // get the variables from the environment and from the cache and then
  // figure out which one to use:

  std::string envVarValue;
  const bool envVarSet = cmSystemTools::GetEnv(envVar, envVarValue);

  std::string cacheEntryName = cmStrCat("CMAKE_ECLIPSE_ENVVAR_", envVar);
  cmValue cacheValue = lg.GetState()->GetInitializedCacheValue(cacheEntryName);

  // now we have both, decide which one to use
  std::string valueToUse;
  if (!envVarSet && !cacheValue) {
    // nothing known, do nothing
    valueToUse.clear();
  } else if (envVarSet && !cacheValue) {
    // The variable is in the env, but not in the cache. Use it and put it
    // in the cache
    valueToUse = envVarValue;
    mf->AddCacheDefinition(cacheEntryName, valueToUse, cacheEntryName,
                           cmStateEnums::STRING, true);
    mf->GetCMakeInstance()->SaveCache(lg.GetBinaryDirectory());
  } else if (!envVarSet && cacheValue) {
    // It is already in the cache, but not in the env, so use it from the cache
    valueToUse = *cacheValue;
  } else {
    // It is both in the cache and in the env.
    // Use the version from the env. except if the value from the env is
    // completely contained in the value from the cache (for the case that we
    // now have a PATH without MSVC dirs in the env. but had the full PATH with
    // all MSVC dirs during the cmake run which stored the var in the cache:
    valueToUse = *cacheValue;
    if (valueToUse.find(envVarValue) == std::string::npos) {
      valueToUse = envVarValue;
      mf->AddCacheDefinition(cacheEntryName, valueToUse, cacheEntryName,
                             cmStateEnums::STRING, true);
      mf->GetCMakeInstance()->SaveCache(lg.GetBinaryDirectory());
    }
  }

  if (!valueToUse.empty()) {
    out << envVar << "=" << valueToUse << "|";
  }
}